

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  
  if ((radius == 0.0) && (!NAN(radius))) {
    iVar8 = (this->_Path).Size;
    if (iVar8 == (this->_Path).Capacity) {
      if (iVar8 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar8 / 2 + iVar8;
      }
      iVar4 = iVar8 + 1;
      if (iVar8 + 1 < iVar7) {
        iVar4 = iVar7;
      }
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
      pIVar6 = (this->_Path).Data;
      if (pIVar6 == (ImVec2 *)0x0) {
        pIVar6 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar5,pIVar6,(long)(this->_Path).Size << 3);
        pIVar6 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar6);
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar4;
      iVar8 = (this->_Path).Size;
    }
    else {
      pIVar5 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar8 + 1;
    pIVar5[iVar8] = *centre;
  }
  lVar10 = (long)(num_segments + 1) + (long)(this->_Path).Size;
  iVar8 = (int)lVar10;
  if ((this->_Path).Capacity < iVar8) {
    pIVar6 = (ImVec2 *)ImGui::MemAlloc(lVar10 * 8);
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) {
      pIVar5 = (ImVec2 *)0x0;
    }
    else {
      memcpy(pIVar6,pIVar5,(long)(this->_Path).Size << 3);
      pIVar5 = (this->_Path).Data;
    }
    ImGui::MemFree(pIVar5);
    (this->_Path).Data = pIVar6;
    (this->_Path).Capacity = iVar8;
  }
  if (-1 < num_segments) {
    iVar8 = 0;
    do {
      fVar12 = ((float)iVar8 / (float)num_segments) * (amax - amin) + amin;
      fVar1 = centre->x;
      fVar11 = cosf(fVar12);
      fVar2 = centre->y;
      fVar12 = sinf(fVar12);
      iVar7 = (this->_Path).Size;
      if (iVar7 == (this->_Path).Capacity) {
        if (iVar7 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar7 / 2 + iVar7;
        }
        iVar9 = iVar7 + 1;
        if (iVar7 + 1 < iVar4) {
          iVar9 = iVar4;
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
        pIVar6 = (this->_Path).Data;
        if (pIVar6 == (ImVec2 *)0x0) {
          pIVar6 = (ImVec2 *)0x0;
        }
        else {
          memcpy(pIVar5,pIVar6,(long)(this->_Path).Size << 3);
          pIVar6 = (this->_Path).Data;
        }
        ImGui::MemFree(pIVar6);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar9;
        iVar7 = (this->_Path).Size;
      }
      else {
        pIVar5 = (this->_Path).Data;
      }
      (this->_Path).Size = iVar7 + 1;
      IVar3.y = fVar2 + fVar12 * radius;
      IVar3.x = fVar1 + fVar11 * radius;
      pIVar5[iVar7] = IVar3;
      iVar8 = iVar8 + 1;
    } while (num_segments + 1 != iVar8);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}